

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lacassagne_2016_code.inc.h
# Opt level: O1

void __thiscall LSL_RLE<TTA>::FirstScan(LSL_RLE<TTA> *this)

{
  uint uVar1;
  Mat1b *pMVar2;
  uint **ppuVar3;
  uint *puVar4;
  uint *puVar5;
  int *piVar6;
  uint *puVar7;
  uint *puVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar9 = *(int *)&pMVar2->field_0x8;
  lVar19 = (long)iVar9;
  uVar1 = *(uint *)&pMVar2->field_0xc;
  if (0 < lVar19) {
    lVar10 = 0;
    do {
      ppuVar3 = (this->RLC).prows;
      puVar4 = ppuVar3[lVar10];
      uVar15 = 0;
      uVar16 = 0;
      uVar14 = 0;
      if (0 < (int)uVar1) {
        pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        puVar5 = (this->ER).prows[lVar10];
        lVar18 = **(long **)&pMVar2->field_0x48;
        lVar12 = *(long *)&pMVar2->field_0x10;
        uVar17 = 0;
        uVar16 = 0;
        uVar15 = 0;
        uVar13 = 0;
        do {
          uVar14 = (uint)(*(char *)(lVar18 * lVar10 + lVar12 + uVar17) != '\0');
          if (uVar13 != uVar14) {
            puVar4[(int)uVar15] = (int)uVar17 - uVar16;
            uVar16 = uVar16 ^ 1;
            uVar15 = uVar15 + 1;
          }
          puVar5[uVar17] = uVar15;
          uVar17 = uVar17 + 1;
          uVar13 = uVar14;
        } while (uVar1 != uVar17);
      }
      puVar4[(int)uVar15] = uVar1 - uVar16;
      this->ner[lVar10] = uVar15 + uVar14;
      ppuVar3[lVar10 + 1] = puVar4 + (long)(int)(uVar15 + uVar14) + 1;
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar19);
  }
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  memset(*(this->ERA).prows,0,(long)(int)((uVar1 + 1) * iVar9) << 2);
  puVar8 = TTA::tail_;
  puVar5 = TTA::next_;
  puVar4 = TTA::rtable_;
  piVar6 = this->ner;
  if (0 < *piVar6) {
    puVar7 = *(this->ERA).prows;
    lVar10 = 1;
    do {
      puVar4[TTA::length_] = TTA::length_;
      puVar5[TTA::length_] = 0xffffffff;
      puVar8[TTA::length_] = TTA::length_;
      uVar14 = TTA::length_ + 1;
      puVar7[lVar10] = TTA::length_;
      TTA::length_ = uVar14;
      lVar10 = lVar10 + 2;
    } while (lVar10 <= *piVar6);
  }
  if (1 < iVar9) {
    lVar10 = 1;
    do {
      if (0 < this->ner[lVar10]) {
        ppuVar3 = (this->ERA).prows;
        puVar4 = ppuVar3[lVar10 + -1];
        puVar5 = ppuVar3[lVar10];
        puVar8 = (this->ER).prows[lVar10 + -1];
        puVar7 = (this->RLC).prows[lVar10];
        lVar18 = 1;
        do {
          uVar14 = puVar7[lVar18 + -1];
          uVar15 = puVar7[lVar18];
          uVar15 = puVar8[(int)(((int)uVar15 < (int)(uVar1 - 1)) + uVar15)];
          uVar17 = (long)(int)puVar8[(int)(uVar14 - (0 < (int)uVar14))] | 1;
          iVar11 = uVar15 + (uVar15 & 1) + -1;
          iVar9 = (int)uVar17;
          if (iVar11 < iVar9) {
            TTA::rtable_[TTA::length_] = TTA::length_;
            TTA::next_[TTA::length_] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar14 = TTA::length_;
            TTA::length_ = TTA::length_ + 1;
          }
          else {
            uVar14 = TTA::rtable_[puVar4[uVar17]];
            iVar9 = iVar9 + 2;
            if (iVar9 <= iVar11) {
              lVar12 = (long)iVar9;
              do {
                uVar15 = TTA::rtable_[puVar4[lVar12]];
                if ((int)uVar14 < (int)uVar15) {
                  TTA::UpdateTable(uVar15,uVar14);
                }
                if ((int)uVar15 < (int)uVar14) {
                  TTA::UpdateTable(uVar14,uVar15);
                  uVar14 = uVar15;
                }
                lVar12 = lVar12 + 2;
              } while (lVar12 <= iVar11);
            }
          }
          puVar5[lVar18] = uVar14;
          lVar18 = lVar18 + 2;
        } while ((int)lVar18 <= this->ner[lVar10]);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar19);
  }
  return;
}

Assistant:

void FirstScan()
    {
        int rows = img_.rows;
        int cols = img_.cols;

        // Step 1
        for (int r = 0; r < rows; ++r) {
            // Get pointers to rows
            const unsigned char* img_r = img_.ptr<unsigned char>(r);
            unsigned* ER_r = ER.prows[r];
            unsigned* RLC_r = RLC.prows[r];
            int x0;
            int x1 = 0; // Previous value of X
            int f = 0;  // Front detection
            ZOA_MOD0
            int er = 0;
            for (int c = 0; c < cols; ++c) {
                x0 = img_r[c] > 0;
                f = x0 ^ x1;
                RLE_MOD1{
                    RLC_r[er] = c ZOA_MOD1;
                    ZOA_MOD2
                        er = er + RLE_MOD2;
                }
                ER_r[c] = er;
                x1 = x0;
            }
            ZOA_MOD3
                RLC_r[er] = cols ZOA_MOD1;
            ZOA_MOD4
                ner[r] = er;
            // Compact RLC usage
            RLC.prows[r + 1] = RLC_r + er + 1;
        }